

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_shufflin_cell(REF_NODE ref_node,REF_CELL ref_cell)

{
  int iVar1;
  REF_MPI ref_mpi;
  bool bVar2;
  REF_STATUS RVar3;
  uint uVar4;
  int iVar5;
  REF_INT *pRVar6;
  long lVar7;
  REF_GLOB *pRVar8;
  long lVar9;
  undefined8 uVar10;
  int iVar11;
  REF_INT cell;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  REF_INT *send_size;
  long lVar16;
  bool bVar17;
  REF_INT nunique;
  REF_INT nodes [27];
  REF_INT unique_parts [27];
  REF_INT all_parts [27];
  REF_STATUS local_1d4;
  int local_1c4;
  REF_INT *local_1c0;
  void *local_1b8;
  void *local_1b0;
  REF_INT *local_1a8;
  REF_GLOB *local_1a0;
  int *local_198;
  int local_190;
  REF_INT local_18c;
  REF_INT local_188 [28];
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  ref_mpi = ref_node->ref_mpi;
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  pRVar6 = (REF_INT *)malloc((long)ref_mpi->n << 2);
  if (pRVar6 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x5dd
           ,"ref_migrate_shufflin_cell","malloc a_size of REF_INT NULL");
    send_size = (REF_INT *)0x0;
  }
  else {
    send_size = pRVar6;
    if (0 < ref_mpi->n) {
      lVar7 = 0;
      do {
        pRVar6[lVar7] = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < ref_mpi->n);
    }
  }
  if (pRVar6 == (REF_INT *)0x0) {
    return 2;
  }
  if ((long)ref_mpi->n < 0) {
    local_1d4 = 1;
    pcVar12 = "malloc b_size of REF_INT negative";
LAB_0021ef79:
    bVar17 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x5de
           ,"ref_migrate_shufflin_cell",pcVar12);
    local_1c0 = (REF_INT *)0x0;
  }
  else {
    local_1c0 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (local_1c0 == (REF_INT *)0x0) {
      local_1d4 = 2;
      pcVar12 = "malloc b_size of REF_INT NULL";
      goto LAB_0021ef79;
    }
    local_1d4 = 2;
    bVar17 = true;
    if (0 < ref_mpi->n) {
      lVar7 = 0;
      do {
        local_1c0[lVar7] = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < ref_mpi->n);
    }
  }
  if (!bVar17) {
    return local_1d4;
  }
  if (0 < ref_cell->max) {
    iVar11 = 0;
    do {
      RVar3 = ref_cell_nodes(ref_cell,iVar11,local_188);
      if (RVar3 == 0) {
        iVar5 = ref_cell->node_per;
        if (0 < (long)iVar5) {
          pRVar6 = ref_node->part;
          lVar7 = 0;
          do {
            local_a8[lVar7] = pRVar6[local_188[lVar7]];
            lVar7 = lVar7 + 1;
          } while (iVar5 != lVar7);
        }
        uVar4 = ref_sort_unique_int(iVar5,local_a8,&local_1c4,local_118);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x5e6,"ref_migrate_shufflin_cell",(ulong)uVar4,"unique");
          return uVar4;
        }
        if (0 < (long)local_1c4) {
          lVar7 = 0;
          do {
            if (ref_mpi->id != local_118[lVar7]) {
              send_size[local_118[lVar7]] = send_size[local_118[lVar7]] + 1;
            }
            lVar7 = lVar7 + 1;
          } while (local_1c4 != lVar7);
        }
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < ref_cell->max);
  }
  uVar4 = ref_mpi_alltoall(ref_mpi,send_size,local_1c0,1);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x5ee
           ,"ref_migrate_shufflin_cell",(ulong)uVar4,"alltoall sizes");
    return uVar4;
  }
  iVar11 = ref_mpi->n;
  lVar7 = (long)iVar11;
  if (lVar7 < 1) {
    iVar5 = 0;
  }
  else {
    lVar9 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + send_size[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  iVar1 = ref_cell->size_per;
  uVar4 = iVar5 * iVar1;
  if ((int)uVar4 < 0) {
    pcVar12 = "malloc a_c2n of REF_GLOB negative";
    uVar10 = 0x5f2;
LAB_0021f175:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar10,"ref_migrate_shufflin_cell",pcVar12);
    RVar3 = 1;
  }
  else {
    local_1b0 = malloc((ulong)uVar4 * 8);
    if (local_1b0 == (void *)0x0) {
      pcVar12 = "malloc a_c2n of REF_GLOB NULL";
      uVar10 = 0x5f2;
    }
    else {
      local_1b8 = malloc((ulong)uVar4 << 2);
      if (local_1b8 == (void *)0x0) {
        pcVar12 = "malloc a_parts of REF_INT NULL";
        uVar10 = 0x5f3;
      }
      else {
        if (iVar11 < 1) {
          iVar5 = 0;
        }
        else {
          lVar9 = 0;
          iVar5 = 0;
          do {
            iVar5 = iVar5 + local_1c0[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar7 != lVar9);
        }
        uVar4 = iVar1 * iVar5;
        if ((int)uVar4 < 0) {
          pcVar12 = "malloc b_c2n of REF_GLOB negative";
          uVar10 = 0x5f7;
          goto LAB_0021f175;
        }
        local_190 = iVar5;
        pRVar8 = (REF_GLOB *)malloc((ulong)uVar4 * 8);
        if (pRVar8 == (REF_GLOB *)0x0) {
          pcVar12 = "malloc b_c2n of REF_GLOB NULL";
          uVar10 = 0x5f7;
        }
        else {
          local_1a0 = pRVar8;
          pRVar6 = (REF_INT *)malloc((ulong)uVar4 << 2);
          if (pRVar6 == (REF_INT *)0x0) {
            pcVar12 = "malloc b_parts of REF_INT NULL";
            uVar10 = 0x5f8;
          }
          else {
            if (iVar11 < 0) {
              pcVar12 = "malloc a_next of REF_INT negative";
              uVar10 = 0x5fa;
              goto LAB_0021f175;
            }
            local_1a8 = pRVar6;
            local_198 = (int *)malloc(lVar7 * 4);
            if (local_198 != (int *)0x0) {
              *local_198 = 0;
              if (1 < iVar11) {
                iVar11 = *local_198;
                lVar9 = 0;
                do {
                  iVar11 = iVar11 + send_size[lVar9];
                  local_198[lVar9 + 1] = iVar11;
                  lVar9 = lVar9 + 1;
                } while (lVar7 + -1 != lVar9);
              }
              if (0 < ref_cell->max) {
                cell = 0;
                do {
                  local_18c = cell;
                  RVar3 = ref_cell_nodes(ref_cell,cell,local_188);
                  if (RVar3 == 0) {
                    iVar11 = ref_cell->node_per;
                    if (0 < (long)iVar11) {
                      pRVar6 = ref_node->part;
                      lVar7 = 0;
                      do {
                        local_a8[lVar7] = pRVar6[local_188[lVar7]];
                        lVar7 = lVar7 + 1;
                      } while (iVar11 != lVar7);
                    }
                    uVar4 = ref_sort_unique_int(iVar11,local_a8,&local_1c4,local_118);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x605,"ref_migrate_shufflin_cell",(ulong)uVar4,"unique");
                      return uVar4;
                    }
                    if (0 < (long)local_1c4) {
                      lVar7 = 0;
                      do {
                        iVar11 = local_118[lVar7];
                        if (ref_mpi->id != iVar11) {
                          iVar5 = ref_cell->node_per;
                          lVar9 = (long)iVar5;
                          if (0 < lVar9) {
                            pRVar6 = ref_node->part;
                            lVar13 = (long)(local_198[iVar11] * ref_cell->size_per);
                            lVar14 = 0;
                            do {
                              lVar15 = (long)local_188[lVar14];
                              lVar16 = -1;
                              if (((-1 < lVar15) && (local_188[lVar14] < ref_node->max)) &&
                                 (lVar16 = ref_node->global[lVar15], lVar16 < 0)) {
                                lVar16 = -1;
                              }
                              *(long *)((long)local_1b0 + lVar14 * 8 + lVar13 * 8) = lVar16;
                              *(REF_INT *)((long)local_1b8 + lVar14 * 4 + lVar13 * 4) =
                                   pRVar6[lVar15];
                              lVar14 = lVar14 + 1;
                            } while (lVar9 != lVar14);
                          }
                          if (ref_cell->last_node_is_an_id != 0) {
                            lVar13 = (long)(local_198[iVar11] * ref_cell->size_per + iVar5);
                            *(long *)((long)local_1b0 + lVar13 * 8) = (long)local_188[lVar9];
                            *(undefined4 *)((long)local_1b8 + lVar13 * 4) = 0xffffffff;
                          }
                          local_198[iVar11] = local_198[iVar11] + 1;
                        }
                        lVar7 = lVar7 + 1;
                      } while (lVar7 != local_1c4);
                    }
                  }
                  cell = local_18c + 1;
                } while (cell < ref_cell->max);
              }
              uVar4 = ref_mpi_alltoallv(ref_mpi,local_1b0,send_size,local_1a0,local_1c0,
                                        ref_cell->size_per,2);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x61d,"ref_migrate_shufflin_cell",(ulong)uVar4,"alltoallv c2n");
                return uVar4;
              }
              uVar4 = ref_mpi_alltoallv(ref_mpi,local_1b8,send_size,local_1a8,local_1c0,
                                        ref_cell->size_per,1);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x620,"ref_migrate_shufflin_cell",(ulong)uVar4,"alltoallv parts");
                return uVar4;
              }
              uVar4 = ref_cell_add_many_global
                                (ref_cell,ref_node,local_190,local_1a0,local_1a8,ref_mpi->id);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x624,"ref_migrate_shufflin_cell",(ulong)uVar4,"g");
                return uVar4;
              }
              free(local_198);
              free(local_1a8);
              free(local_1a0);
              free(local_1b8);
              free(local_1b0);
              free(local_1c0);
              free(send_size);
              if (ref_cell->max < 1) {
                return 0;
              }
              iVar11 = 0;
              do {
                RVar3 = ref_cell_nodes(ref_cell,iVar11,local_188);
                if (RVar3 == 0) {
                  if (0 < (long)ref_cell->node_per) {
                    lVar7 = 0;
                    bVar17 = false;
                    do {
                      bVar2 = !bVar17;
                      bVar17 = true;
                      if (bVar2) {
                        bVar17 = ref_mpi->id == ref_node->part[local_188[lVar7]];
                      }
                      lVar7 = lVar7 + 1;
                    } while (ref_cell->node_per != lVar7);
                    if (bVar17) goto LAB_0021f618;
                  }
                  uVar4 = ref_cell_remove(ref_cell,iVar11);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x634,"ref_migrate_shufflin_cell",(ulong)uVar4,"remove");
                    return uVar4;
                  }
                }
LAB_0021f618:
                iVar11 = iVar11 + 1;
                if (ref_cell->max <= iVar11) {
                  return 0;
                }
              } while( true );
            }
            pcVar12 = "malloc a_next of REF_INT NULL";
            uVar10 = 0x5fa;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar10,"ref_migrate_shufflin_cell",pcVar12);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_shufflin_cell(REF_NODE ref_node,
                                             REF_CELL ref_cell) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT all_parts[REF_CELL_MAX_SIZE_PER];
  REF_INT nunique;
  REF_INT unique_parts[REF_CELL_MAX_SIZE_PER];
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT part, node, cell, i;
  REF_INT *a_next;
  REF_GLOB *a_c2n, *b_c2n;
  REF_INT *a_parts, *b_parts;
  REF_BOOL need_to_keep;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      all_parts[node] = ref_node_part(ref_node, nodes[node]);
    }
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), all_parts, &nunique,
                            unique_parts),
        "unique");
    for (node = 0; node < nunique; node++) {
      part = unique_parts[node];
      if (ref_mpi_rank(ref_mpi) != part) a_size[part]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_c2n, ref_cell_size_per(ref_cell) * a_total, REF_GLOB);
  ref_malloc(a_parts, ref_cell_size_per(ref_cell) * a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_c2n, ref_cell_size_per(ref_cell) * b_total, REF_GLOB);
  ref_malloc(b_parts, ref_cell_size_per(ref_cell) * b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      all_parts[node] = ref_node_part(ref_node, nodes[node]);
    }
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), all_parts, &nunique,
                            unique_parts),
        "unique");
    for (node = 0; node < nunique; node++) {
      part = unique_parts[node];
      if (ref_mpi_rank(ref_mpi) != part) {
        for (i = 0; i < ref_cell_node_per(ref_cell); i++) {
          a_c2n[i + ref_cell_size_per(ref_cell) * a_next[part]] =
              ref_node_global(ref_node, nodes[i]);
          a_parts[i + ref_cell_size_per(ref_cell) * a_next[part]] =
              ref_node_part(ref_node, nodes[i]);
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          a_c2n[ref_cell_node_per(ref_cell) +
                ref_cell_size_per(ref_cell) * a_next[part]] =
              (REF_GLOB)nodes[ref_cell_node_per(ref_cell)];
          a_parts[ref_cell_node_per(ref_cell) +
                  ref_cell_size_per(ref_cell) * a_next[part]] = REF_EMPTY;
        }
        a_next[part]++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_c2n, a_size, b_c2n, b_size,
                        ref_cell_size_per(ref_cell), REF_GLOB_TYPE),
      "alltoallv c2n");
  RSS(ref_mpi_alltoallv(ref_mpi, a_parts, a_size, b_parts, b_size,
                        ref_cell_size_per(ref_cell), REF_INT_TYPE),
      "alltoallv parts");

  RSS(ref_cell_add_many_global(ref_cell, ref_node, b_total, b_c2n, b_parts,
                               ref_mpi_rank(ref_mpi)),
      "g");

  free(a_next);
  free(b_parts);
  free(b_c2n);
  free(a_parts);
  free(a_c2n);
  free(b_size);
  free(a_size);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    need_to_keep = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      need_to_keep = (need_to_keep || (ref_mpi_rank(ref_mpi) ==
                                       ref_node_part(ref_node, nodes[node])));
    }
    if (!need_to_keep) RSS(ref_cell_remove(ref_cell, cell), "remove");
  }

  return REF_SUCCESS;
}